

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O2

ProcessorProperty * __thiscall
soul::StructuralParser::parseProcessorProperty(StructuralParser *this)

{
  Property PVar1;
  int iVar2;
  UnqualifiedName *this_00;
  ModuleBase *pMVar3;
  ProcessorProperty *pPVar4;
  Property property;
  Context context;
  Property local_c4;
  Context local_c0;
  string local_a8;
  CompileMessage local_88;
  CompileMessage local_50;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x29b542);
  getContext(&local_c0,this);
  this_00 = parseUnqualifiedName(this);
  AST::UnqualifiedName::toString_abi_cxx11_(&local_a8,this_00);
  PVar1 = heart::ProcessorProperty::getPropertyFromName(&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  local_c4 = PVar1;
  if (PVar1 == none) {
    Errors::unknownProperty<>();
    AST::Context::throwError
              (&(this_00->super_Expression).super_Statement.super_ASTObject.context,&local_50,false)
    ;
  }
  pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
  iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[4])(pMVar3);
  if ((char)iVar2 == '\0') {
    pMVar3 = pool_ptr<soul::AST::ModuleBase>::operator->(&this->module);
    iVar2 = (*(pMVar3->super_ASTObject)._vptr_ASTObject[5])(pMVar3);
    if ((char)iVar2 == '\0') {
      Errors::propertiesOutsideProcessor<>();
      AST::Context::throwError(&local_c0,&local_88,false);
    }
  }
  pPVar4 = allocate<soul::AST::ProcessorProperty,soul::AST::Context&,soul::heart::ProcessorProperty::Property&>
                     (this,&local_c0,&local_c4);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr
            ((RefCountedPtr<soul::SourceCodeText> *)&local_c0);
  return pPVar4;
}

Assistant:

AST::ProcessorProperty& parseProcessorProperty()
    {
        expect (Operator::dot);
        auto context = getContext();
        auto& propertyName = parseUnqualifiedName();

        auto property = heart::ProcessorProperty::getPropertyFromName (propertyName.toString());

        if (property == heart::ProcessorProperty::Property::none)
            propertyName.context.throwError (Errors::unknownProperty());

        if (! (module->isProcessor() || module->isGraph()))
            context.throwError (Errors::propertiesOutsideProcessor());

        return allocate<AST::ProcessorProperty> (context, property);
    }